

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SViewFrustum.h
# Opt level: O1

void __thiscall irr::scene::SViewFrustum::recalculateBoundingSphere(SViewFrustum *this)

{
  plane3d<float> *this_00;
  plane3d<float> *o1;
  plane3d<float> *o2;
  plane3d<float> *o2_00;
  plane3d<float> *this_01;
  plane3d<float> *o1_00;
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined8 uVar27;
  float *pfVar28;
  long lVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float diam [8];
  float local_e8;
  float fStack_e4;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  vector3d<float> local_98;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  float fStack_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_98.X = 0.0;
  local_98.Y = 0.0;
  local_98.Z = 0.0;
  this_00 = this->planes + 1;
  o1 = this->planes + 5;
  o2 = this->planes + 2;
  core::plane3d<float>::getIntersectionWithPlanes(this_00,o1,o2,&local_98);
  fVar31 = local_98.Z;
  uVar27 = local_98._0_8_;
  local_98.X = 0.0;
  local_98.Y = 0.0;
  local_98.Z = 0.0;
  o2_00 = this->planes + 3;
  core::plane3d<float>::getIntersectionWithPlanes(this_00,o1,o2_00,&local_98);
  local_e8 = (float)uVar27;
  fStack_e4 = SUB84(uVar27,4);
  local_e8 = local_e8 - local_98.X;
  fStack_e4 = fStack_e4 - local_98.Y;
  fVar31 = (fVar31 - local_98.Z) * (fVar31 - local_98.Z) +
           local_e8 * local_e8 + fStack_e4 * fStack_e4;
  if (fVar31 < 0.0) {
    fVar31 = sqrtf(fVar31);
  }
  else {
    fVar31 = SQRT(fVar31);
  }
  local_98.X = 0.0;
  local_98.Y = 0.0;
  local_98.Z = 0.0;
  this_01 = this->planes;
  core::plane3d<float>::getIntersectionWithPlanes(this_01,o1,o2,&local_98);
  fVar30 = local_98.Z;
  local_a8._0_4_ = local_98.X;
  local_a8._4_4_ = local_98.Y;
  local_a8._8_8_ = 0;
  local_98.X = 0.0;
  local_98.Y = 0.0;
  local_98.Z = 0.0;
  core::plane3d<float>::getIntersectionWithPlanes(this_01,o1,o2_00,&local_98);
  fVar32 = (float)local_a8._0_4_ - local_98.X;
  fVar33 = (float)local_a8._4_4_ - local_98.Y;
  fVar30 = (fVar30 - local_98.Z) * (fVar30 - local_98.Z) + fVar32 * fVar32 + fVar33 * fVar33;
  if (fVar30 < 0.0) {
    fVar30 = sqrtf(fVar30);
  }
  else {
    fVar30 = SQRT(fVar30);
  }
  fVar32 = this->FarNearDistance;
  fVar32 = (((fVar31 + fVar30) * (fVar31 - fVar30)) / (fVar32 * 4.0) + fVar32) * -0.5 + fVar32;
  uVar7 = this->planes[1].Normal.X;
  uVar17 = this->planes[1].Normal.Y;
  uVar8 = (this->cameraPosition).X;
  uVar18 = (this->cameraPosition).Y;
  fVar31 = this->planes[1].Normal.Z;
  fVar30 = (this->cameraPosition).Z;
  (this->BoundingCenter).X = (float)uVar8 - fVar32 * (float)uVar7;
  (this->BoundingCenter).Y = (float)uVar18 - fVar32 * (float)uVar17;
  (this->BoundingCenter).Z = fVar30 - fVar32 * fVar31;
  pfVar28 = &fStack_6c;
  local_48 = 0.0;
  fStack_44 = 0.0;
  fStack_40 = 0.0;
  fStack_3c = 0.0;
  fStack_58 = 0.0;
  fStack_54 = 0.0;
  uStack_50 = 0;
  local_68 = 0;
  fStack_60 = 0.0;
  fStack_5c = 0.0;
  local_78 = 0.0;
  fStack_74 = 0.0;
  fStack_70 = 0.0;
  fStack_6c = 0.0;
  fStack_88 = 0.0;
  fStack_84 = 0.0;
  uStack_80 = 0;
  local_98.X = 0.0;
  local_98.Y = 0.0;
  local_98.Z = 0.0;
  fStack_8c = 0.0;
  lVar29 = 0;
  local_c8._0_4_ = 0.0;
  local_c8._4_4_ = 0.0;
  uStack_c0._0_4_ = 0.0;
  core::plane3d<float>::getIntersectionWithPlanes(this_01,o1,o2,(vector3d<float> *)local_c8);
  uVar9 = (this->BoundingCenter).X;
  uVar19 = (this->BoundingCenter).Y;
  local_98.Z = (float)uStack_c0 - (this->BoundingCenter).Z;
  local_98.Y = local_c8._4_4_ - (float)uVar19;
  local_98.X = local_c8._0_4_ - (float)uVar9;
  local_c8._0_4_ = 0.0;
  local_c8._4_4_ = 0.0;
  uStack_c0._0_4_ = 0.0;
  core::plane3d<float>::getIntersectionWithPlanes(this_01,o1,o2_00,(vector3d<float> *)local_c8);
  uVar10 = (this->BoundingCenter).X;
  uVar20 = (this->BoundingCenter).Y;
  fStack_8c = local_c8._0_4_ - (float)uVar10;
  fStack_88 = local_c8._4_4_ - (float)uVar20;
  fStack_84 = (float)uStack_c0 - (this->BoundingCenter).Z;
  local_c8._0_4_ = 0.0;
  local_c8._4_4_ = 0.0;
  uStack_c0._0_4_ = 0.0;
  o1_00 = this->planes + 4;
  core::plane3d<float>::getIntersectionWithPlanes(this_01,o1_00,o2,(vector3d<float> *)local_c8);
  uVar11 = (this->BoundingCenter).X;
  uVar21 = (this->BoundingCenter).Y;
  local_78 = (float)uStack_c0 - (this->BoundingCenter).Z;
  uStack_80 = CONCAT44(local_c8._4_4_ - (float)uVar21,local_c8._0_4_ - (float)uVar11);
  local_c8._0_4_ = 0.0;
  local_c8._4_4_ = 0.0;
  uStack_c0._0_4_ = 0.0;
  core::plane3d<float>::getIntersectionWithPlanes(this_01,o1_00,o2_00,(vector3d<float> *)local_c8);
  uVar12 = (this->BoundingCenter).X;
  uVar22 = (this->BoundingCenter).Y;
  fStack_74 = local_c8._0_4_ - (float)uVar12;
  fStack_70 = local_c8._4_4_ - (float)uVar22;
  fStack_6c = (float)uStack_c0 - (this->BoundingCenter).Z;
  local_c8._0_4_ = 0.0;
  local_c8._4_4_ = 0.0;
  uStack_c0._0_4_ = 0.0;
  core::plane3d<float>::getIntersectionWithPlanes(this_00,o1_00,o2_00,(vector3d<float> *)local_c8);
  uVar13 = (this->BoundingCenter).X;
  uVar23 = (this->BoundingCenter).Y;
  fStack_60 = (float)uStack_c0 - (this->BoundingCenter).Z;
  local_68 = CONCAT44(local_c8._4_4_ - (float)uVar23,local_c8._0_4_ - (float)uVar13);
  local_c8._0_4_ = 0.0;
  local_c8._4_4_ = 0.0;
  uStack_c0._0_4_ = 0.0;
  core::plane3d<float>::getIntersectionWithPlanes(this_00,o1_00,o2,(vector3d<float> *)local_c8);
  uVar14 = (this->BoundingCenter).X;
  uVar24 = (this->BoundingCenter).Y;
  fStack_5c = local_c8._0_4_ - (float)uVar14;
  fStack_58 = local_c8._4_4_ - (float)uVar24;
  fStack_54 = (float)uStack_c0 - (this->BoundingCenter).Z;
  local_c8._0_4_ = 0.0;
  local_c8._4_4_ = 0.0;
  uStack_c0._0_4_ = 0.0;
  core::plane3d<float>::getIntersectionWithPlanes(this_00,o1,o2_00,(vector3d<float> *)local_c8);
  uVar15 = (this->BoundingCenter).X;
  uVar25 = (this->BoundingCenter).Y;
  local_48 = (float)uStack_c0 - (this->BoundingCenter).Z;
  uStack_50 = CONCAT44(local_c8._4_4_ - (float)uVar25,local_c8._0_4_ - (float)uVar15);
  local_c8._0_4_ = 0.0;
  local_c8._4_4_ = 0.0;
  uStack_c0 = (ulong)uStack_c0._4_4_ << 0x20;
  core::plane3d<float>::getIntersectionWithPlanes(this_00,o1,o2,(vector3d<float> *)local_c8);
  uVar16 = (this->BoundingCenter).X;
  uVar26 = (this->BoundingCenter).Y;
  fStack_44 = local_c8._0_4_ - (float)uVar16;
  fStack_40 = local_c8._4_4_ - (float)uVar26;
  fStack_3c = (float)uStack_c0 - (this->BoundingCenter).Z;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8._0_4_ = 0.0;
  local_c8._4_4_ = 0.0;
  uStack_c0 = 0;
  do {
    fVar31 = pfVar28[-2];
    fVar30 = pfVar28[-5];
    fVar32 = pfVar28[-8];
    fVar33 = pfVar28[-1];
    fVar2 = pfVar28[-4];
    fVar3 = pfVar28[-7];
    fVar4 = *pfVar28;
    fVar5 = pfVar28[-3];
    fVar6 = pfVar28[-6];
    lVar1 = lVar29 * 4;
    *(float *)(local_c8 + lVar1) =
         pfVar28[-9] * pfVar28[-9] + pfVar28[-0xb] * pfVar28[-0xb] + pfVar28[-10] * pfVar28[-10];
    *(float *)(local_c8 + lVar1 + 4) = fVar6 * fVar6 + fVar32 * fVar32 + fVar3 * fVar3;
    *(float *)((long)&uStack_c0 + lVar1) = fVar5 * fVar5 + fVar30 * fVar30 + fVar2 * fVar2;
    *(float *)((long)&uStack_c0 + lVar1 + 4) = fVar4 * fVar4 + fVar31 * fVar31 + fVar33 * fVar33;
    lVar29 = lVar29 + 4;
    pfVar28 = pfVar28 + 0xc;
  } while (lVar29 != 8);
  lVar29 = 0;
  fVar31 = 0.0;
  do {
    fVar30 = *(float *)(local_c8 + lVar29 * 4);
    if (*(float *)(local_c8 + lVar29 * 4) <= fVar31) {
      fVar30 = fVar31;
    }
    lVar29 = lVar29 + 1;
    fVar31 = fVar30;
  } while (lVar29 != 8);
  if (fVar30 < 0.0) {
    fVar30 = sqrtf(fVar30);
  }
  else {
    fVar30 = SQRT(fVar30);
  }
  this->BoundingRadius = fVar30;
  return;
}

Assistant:

inline void SViewFrustum::recalculateBoundingSphere()
{
	// Find the center
	const float shortlen = (getNearLeftUp() - getNearRightUp()).getLength();
	const float longlen = (getFarLeftUp() - getFarRightUp()).getLength();

	const float farlen = FarNearDistance;
	const float fartocenter = (farlen + (shortlen - longlen) * (shortlen + longlen) / (4 * farlen)) / 2;
	const float neartocenter = farlen - fartocenter;

	BoundingCenter = cameraPosition + -planes[VF_NEAR_PLANE].Normal * neartocenter;

	// Find the radius
	core::vector3df dir[8];
	dir[0] = getFarLeftUp() - BoundingCenter;
	dir[1] = getFarRightUp() - BoundingCenter;
	dir[2] = getFarLeftDown() - BoundingCenter;
	dir[3] = getFarRightDown() - BoundingCenter;
	dir[4] = getNearRightDown() - BoundingCenter;
	dir[5] = getNearLeftDown() - BoundingCenter;
	dir[6] = getNearRightUp() - BoundingCenter;
	dir[7] = getNearLeftUp() - BoundingCenter;

	u32 i = 0;
	float diam[8] = {0.f};

	for (i = 0; i < 8; ++i)
		diam[i] = dir[i].getLengthSQ();

	float longest = 0;

	for (i = 0; i < 8; ++i) {
		if (diam[i] > longest)
			longest = diam[i];
	}

	BoundingRadius = sqrtf(longest);
}